

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

int Ppmd7_DecodeSymbol(CPpmd7 *p,IPpmd7_RangeDec *rc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  ushort uVar6;
  Byte *pBVar7;
  CPpmd_State *pCVar8;
  UInt16 UVar9;
  UInt32 UVar10;
  UInt32 UVar11;
  int iVar12;
  CPpmd7_Context *pCVar13;
  uint uVar14;
  byte *pbVar15;
  long *plVar16;
  ulong uVar17;
  uint uVar18;
  uint numMasked;
  UInt16 *pUVar19;
  byte *pbVar20;
  size_t charMask [32];
  CPpmd_State *ps [256];
  UInt32 local_94c;
  IPpmd7_RangeDec *local_948;
  CPpmd_See *local_940;
  char local_938 [256];
  long local_838 [257];
  
  pCVar13 = p->MinContext;
  local_948 = rc;
  if (pCVar13->NumStats == 1) {
    bVar1 = *(byte *)((long)&pCVar13->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(ulong)*(ushort *)(p->Base + pCVar13->Suffix) - 1];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    pUVar19 = p->BinSumm[(ulong)bVar1 - 1] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) +
              (uint)bVar2 + p->PrevSuccess + (uint)bVar3 +
              (uint)p->HB2Flag[(byte)pCVar13->SummFreq] * 2);
    UVar10 = (*rc->DecodeBit)(rc,(uint)*pUVar19);
    uVar5 = *pUVar19;
    if (UVar10 == 0) {
      *pUVar19 = (uVar5 - (short)(uVar5 + 0x20 >> 7)) + 0x80;
      pCVar13 = p->MinContext;
      p->FoundState = (CPpmd_State *)&pCVar13->SummFreq;
      UVar9 = pCVar13->SummFreq;
      bVar1 = *(byte *)((long)&pCVar13->SummFreq + 1);
      *(byte *)((long)&pCVar13->SummFreq + 1) = bVar1 - ((char)~bVar1 >> 7);
      p->PrevSuccess = 1;
      p->RunLength = p->RunLength + 1;
      NextContext(p);
      return (uint)(byte)UVar9;
    }
    uVar14 = (uint)uVar5 - (uVar5 + 0x20 >> 7);
    *pUVar19 = (ushort)uVar14;
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(uVar14 & 0xffff) >> 10];
    memset(local_938,0xff,0x100);
    pCVar13 = p->MinContext;
    local_938[(byte)pCVar13->SummFreq] = '\0';
    p->PrevSuccess = 0;
  }
  else {
    pBVar7 = p->Base;
    uVar17 = (ulong)pCVar13->Stats;
    UVar10 = (*rc->GetThreshold)(rc,(uint)pCVar13->SummFreq);
    bVar1 = pBVar7[uVar17 + 1];
    if (UVar10 < bVar1) {
      (*rc->Decode)(rc,0,(uint)bVar1);
      p->FoundState = (CPpmd_State *)(pBVar7 + uVar17);
      bVar1 = ((CPpmd_State *)(pBVar7 + uVar17))->Symbol;
      Ppmd7_Update1_0(p);
      return (uint)bVar1;
    }
    p->PrevSuccess = 0;
    iVar12 = p->MinContext->NumStats - 1;
    pbVar15 = pBVar7 + (uVar17 - 6);
    uVar14 = (uint)bVar1;
    do {
      pbVar20 = pbVar15;
      UVar11 = uVar14 + pbVar20[0xd];
      if (UVar10 < UVar11) {
        (*rc->Decode)(rc,uVar14,(uint)pbVar20[0xd]);
        p->FoundState = (CPpmd_State *)(pbVar20 + 0xc);
        bVar1 = pbVar20[0xc];
        Ppmd7_Update1(p);
        return (uint)bVar1;
      }
      pbVar15 = pbVar20 + 6;
      iVar12 = iVar12 + -1;
      uVar14 = UVar11;
    } while (iVar12 != 0);
    uVar14 = (uint)p->MinContext->SummFreq;
    if (uVar14 <= UVar10) {
      return -2;
    }
    p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
    (*rc->Decode)(rc,UVar11,uVar14 - UVar11);
    memset(local_938,0xff,0x100);
    local_938[pbVar20[0xc]] = '\0';
    pCVar13 = p->MinContext;
    iVar12 = pCVar13->NumStats - 1;
    do {
      local_938[*pbVar15] = '\0';
      pbVar15 = pbVar15 + -6;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  while( true ) {
    uVar5 = pCVar13->NumStats;
    uVar14 = p->OrderFall;
    do {
      uVar17 = (ulong)pCVar13->Suffix;
      if (uVar17 == 0) {
        p->OrderFall = uVar14 + 1;
        return -1;
      }
      pBVar7 = p->Base;
      pCVar13 = (CPpmd7_Context *)(pBVar7 + uVar17);
      p->MinContext = pCVar13;
      uVar6 = *(ushort *)(pBVar7 + uVar17);
      uVar14 = uVar14 + 1;
    } while (uVar6 == uVar5);
    p->OrderFall = uVar14;
    pbVar15 = pBVar7 + pCVar13->Stats;
    numMasked = (uint)uVar5;
    uVar14 = 0;
    uVar17 = 0;
    do {
      cVar4 = local_938[*pbVar15];
      uVar14 = uVar14 + ((uint)pbVar15[1] & (int)cVar4);
      local_838[uVar17] = (long)pbVar15;
      pbVar15 = pbVar15 + 6;
      uVar18 = (int)uVar17 - (int)cVar4;
      uVar17 = (ulong)uVar18;
    } while (uVar18 != uVar6 - numMasked);
    local_940 = Ppmd7_MakeEscFreq(p,numMasked,&local_94c);
    UVar10 = local_94c;
    uVar18 = local_94c + uVar14;
    UVar11 = (*local_948->GetThreshold)(local_948,uVar18);
    if (UVar11 < uVar14) break;
    if (uVar18 <= UVar11) {
      return -2;
    }
    (*local_948->Decode)(local_948,uVar14,UVar10);
    local_940->Summ = local_940->Summ + (short)uVar18;
    iVar12 = numMasked - uVar6;
    plVar16 = local_838 + (~numMasked + (uint)uVar6);
    do {
      local_938[*(byte *)*plVar16] = '\0';
      plVar16 = plVar16 + -1;
      iVar12 = iVar12 + 1;
    } while (iVar12 != 0);
    pCVar13 = p->MinContext;
  }
  plVar16 = local_838;
  uVar14 = 0;
  do {
    UVar10 = uVar14;
    pCVar8 = (CPpmd_State *)*plVar16;
    uVar14 = UVar10 + pCVar8->Freq;
    plVar16 = plVar16 + 1;
  } while (uVar14 <= UVar11);
  (*local_948->Decode)(local_948,UVar10,(uint)pCVar8->Freq);
  bVar1 = local_940->Shift;
  if (bVar1 < 7) {
    pBVar7 = &local_940->Count;
    *pBVar7 = *pBVar7 + 0xff;
    if (*pBVar7 == '\0') {
      local_940->Summ = local_940->Summ << 1;
      local_940->Shift = bVar1 + 1;
      local_940->Count = (Byte)(3 << (bVar1 & 0x1f));
    }
  }
  p->FoundState = pCVar8;
  bVar1 = pCVar8->Symbol;
  Ppmd7_Update2(p);
  return (uint)bVar1;
}

Assistant:

static int Ppmd7_DecodeSymbol(CPpmd7 *p, IPpmd7_RangeDec *rc)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = rc->GetThreshold(rc, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      rc->Decode(rc, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        rc->Decode(rc, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd7_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    rc->Decode(rc, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    if (rc->DecodeBit(rc, *prob) == 0)
    {
      Byte symbol;
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd7Context_OneState(p->MinContext))->Symbol;
      Ppmd7_UpdateBin(p);
      return symbol;
    }
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd7Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd7_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);

    see = Ppmd7_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = rc->GetThreshold(rc, freqSum);

    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      rc->Decode(rc, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    rc->Decode(rc, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}